

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

string * testing::internal::JoinAsKeyValueTuple
                   (string *__return_storage_ptr__,
                   vector<const_char_*,_std::allocator<const_char_*>_> *names,Strings *values)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  size_t i;
  undefined1 local_49;
  Strings *local_48;
  anon_class_16_2_1175fbd1 build_one;
  GTestLog local_24;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_20;
  Strings *values_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *names_local;
  string *result;
  
  local_20 = (vector<const_char_*,_std::allocator<const_char_*>_> *)values;
  values_local = (Strings *)names;
  names_local = (vector<const_char_*,_std::allocator<const_char_*>_> *)__return_storage_ptr__;
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(names);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_20);
  bVar2 = IsTrue(sVar3 == sVar4);
  if (!bVar2) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O0/googletest-src/googlemock/src/gmock-internal-utils.cc"
                       ,0x3d);
    poVar5 = GTestLog::GetStream(&local_24);
    std::operator<<(poVar5,"Condition names.size() == values.size() failed. ");
    GTestLog::~GTestLog(&local_24);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_20);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&build_one.values + 3))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&build_one.values + 3));
  }
  else {
    local_48 = values_local;
    build_one.names = local_20;
    local_49 = 0;
    JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::operator()[abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&local_48,0);
    std::operator+(__return_storage_ptr__,"(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::__cxx11::string::~string((string *)&i);
    for (local_78 = 1; uVar1 = local_78,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_20), uVar1 < sVar3; local_78 = local_78 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::$_0::operator()[abi_cxx11_(&local_98,&local_48,local_78);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsKeyValueTuple(
    const std::vector<const char*>& names, const Strings& values) {
  GTEST_CHECK_(names.size() == values.size());
  if (values.empty()) {
    return "";
  }
  const auto build_one = [&](const size_t i) {
    return std::string(names[i]) + ": " + values[i];
  };
  std::string result = "(" + build_one(0);
  for (size_t i = 1; i < values.size(); i++) {
    result += ", ";
    result += build_one(i);
  }
  result += ")";
  return result;
}